

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenReader.cpp
# Opt level: O3

int __thiscall ninx::parser::TokenReader::check_limiter(TokenReader *this,char limiter)

{
  pointer puVar1;
  tuple<ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_> tVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  Limiter *this_00;
  
  puVar1 = (this->tokens->
           super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = 0xffffffff;
  if (((ulong)(long)this->current_token <
       (ulong)((long)(this->tokens->
                     super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) &&
     (tVar2.
      super__Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
      .super__Head_base<0UL,_ninx::lexer::token::Token_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
             *)&puVar1[this->current_token]._M_t.
                super___uniq_ptr_impl<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
     , tVar2.
       super__Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
       .super__Head_base<0UL,_ninx::lexer::token::Token_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ninx::lexer::token::Token_*,_false>)0x0)) {
    iVar4 = (**(code **)(*(long *)tVar2.
                                  super__Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
                                  .super__Head_base<0UL,_ninx::lexer::token::Token_*,_false>.
                                  _M_head_impl + 0x10))
                      (tVar2.
                       super__Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
                       .super__Head_base<0UL,_ninx::lexer::token::Token_*,_false>._M_head_impl);
    uVar5 = 0;
    if (iVar4 == 1) {
      this_00 = (Limiter *)
                __dynamic_cast(tVar2.
                               super__Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
                               .super__Head_base<0UL,_ninx::lexer::token::Token_*,_false>.
                               _M_head_impl,&lexer::token::Token::typeinfo,
                               &lexer::token::Limiter::typeinfo,0);
      cVar3 = lexer::token::Limiter::get_limiter(this_00);
      uVar5 = (uint)(cVar3 == limiter);
    }
  }
  return uVar5;
}

Assistant:

int ninx::parser::TokenReader::check_limiter(char limiter) {
    auto token = peek_token();
    if (!token) {
        return -1;
    }

    if (token->get_type() != Type::LIMITER) {
        return 0;
    }

    if (dynamic_cast<ninx::lexer::token::Limiter*>(token)->get_limiter() == limiter) {
        return 1;
    }

    return 0;
}